

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cc
# Opt level: O2

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* split(string *s,char *delim,
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *elems)

{
  istream *piVar1;
  string item;
  stringstream ss;
  
  std::__cxx11::stringstream::stringstream((stringstream *)&ss,(string *)s,_S_out|_S_in);
  item._M_dataplus._M_p = (pointer)&item.field_2;
  item._M_string_length = 0;
  item.field_2._M_local_buf[0] = '\0';
  while( true ) {
    piVar1 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&ss,(string *)&item,*delim);
    if (((byte)piVar1[*(long *)(*(long *)piVar1 + -0x18) + 0x20] & 5) != 0) break;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(elems,&item);
  }
  std::__cxx11::string::~string((string *)&item);
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return elems;
}

Assistant:

std::vector<std::string>& split(const std::string& s,
        const char& delim,
        std::vector<std::string>* elems) {
    std::stringstream ss(s);
    std::string item;
    while (std::getline(ss, item, delim)) {
         elems->push_back(item);
    }
    return *elems;
}